

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Function::InternalSwap(Function *this,Function *other)

{
  int iVar1;
  string *psVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->inputs_).super_RepeatedPtrFieldBase,
             &(other->inputs_).super_RepeatedPtrFieldBase);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>
  ::swap(&(this->block_specializations_).map_,&(other->block_specializations_).map_);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::swap(&(this->attributes_).map_,&(other->attributes_).map_);
  psVar2 = (this->opset_).ptr_;
  (this->opset_).ptr_ = (other->opset_).ptr_;
  (other->opset_).ptr_ = psVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void Function::InternalSwap(Function* other) {
  inputs_.InternalSwap(&other->inputs_);
  block_specializations_.Swap(&other->block_specializations_);
  attributes_.Swap(&other->attributes_);
  opset_.Swap(&other->opset_);
  std::swap(_cached_size_, other->_cached_size_);
}